

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

OutputInfo * __thiscall cmTarget::GetOutputInfo(cmTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  iterator iVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>,_bool>
  pVar5;
  string config_upper;
  string msg;
  size_type __dnew;
  key_type local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
  local_110;
  OutputInfo local_90;
  
  if (this->IsImportedTarget == false) {
    if (this->TargetTypeValue < OBJECT_LIBRARY) {
      paVar1 = &local_130.field_2;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      local_130._M_dataplus._M_p = (pointer)paVar1;
      if (config->_M_string_length != 0) {
        cmsys::SystemTools::UpperCase(&local_110.first,config);
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.first._M_dataplus._M_p != &local_110.first.field_2) {
          operator_delete(local_110.first._M_dataplus._M_p,
                          local_110.first.field_2._M_allocated_capacity + 1);
        }
      }
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>_>
              ::find(&(((this->Internal).Pointer)->OutputInfoMap)._M_t,&local_130);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(((this->Internal).Pointer)->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        local_90.OutDir._M_dataplus._M_p = (pointer)&local_90.OutDir.field_2;
        local_90.OutDir._M_string_length = 0;
        local_90.OutDir.field_2._M_local_buf[0] = '\0';
        local_90.ImpDir._M_dataplus._M_p = (pointer)&local_90.ImpDir.field_2;
        local_90.ImpDir._M_string_length = 0;
        local_90.ImpDir.field_2._M_local_buf[0] = '\0';
        local_90.PdbDir._M_dataplus._M_p = (pointer)&local_90.PdbDir.field_2;
        local_90.PdbDir._M_string_length = 0;
        local_90.PdbDir.field_2._M_local_buf[0] = '\0';
        ComputeOutputDir(this,config,false,&local_90.OutDir);
        ComputeOutputDir(this,config,true,&local_90.ImpDir);
        paVar2 = &local_110.first.field_2;
        local_110.first.field_2._M_allocated_capacity._0_4_ = 0x424450;
        local_110.first._M_string_length = 3;
        local_110.first._M_dataplus._M_p = (pointer)paVar2;
        bVar3 = ComputePDBOutputDir(this,&local_110.first,config,&local_90.PdbDir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_110.first._M_dataplus._M_p,
                          local_110.first.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          std::__cxx11::string::_M_assign((string *)&local_90.PdbDir);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::OutputInfo_&,_true>
                  (&local_110,&local_130,&local_90);
        pVar5 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>>
                            *)&((this->Internal).Pointer)->OutputInfoMap,&local_110);
        iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.second.PdbDir._M_dataplus._M_p != &local_110.second.PdbDir.field_2) {
          operator_delete(local_110.second.PdbDir._M_dataplus._M_p,
                          local_110.second.PdbDir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.second.ImpDir._M_dataplus._M_p != &local_110.second.ImpDir.field_2) {
          operator_delete(local_110.second.ImpDir._M_dataplus._M_p,
                          local_110.second.ImpDir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.second.OutDir._M_dataplus._M_p != &local_110.second.OutDir.field_2) {
          operator_delete(local_110.second.OutDir._M_dataplus._M_p,
                          local_110.second.OutDir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_110.first._M_dataplus._M_p,
                          local_110.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.PdbDir._M_dataplus._M_p != &local_90.PdbDir.field_2) {
          operator_delete(local_90.PdbDir._M_dataplus._M_p,
                          CONCAT71(local_90.PdbDir.field_2._M_allocated_capacity._1_7_,
                                   local_90.PdbDir.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.ImpDir._M_dataplus._M_p != &local_90.ImpDir.field_2) {
          operator_delete(local_90.ImpDir._M_dataplus._M_p,
                          CONCAT71(local_90.ImpDir.field_2._M_allocated_capacity._1_7_,
                                   local_90.ImpDir.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.OutDir._M_dataplus._M_p != &local_90.OutDir.field_2) {
          operator_delete(local_90.OutDir._M_dataplus._M_p,
                          CONCAT71(local_90.OutDir.field_2._M_allocated_capacity._1_7_,
                                   local_90.OutDir.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      return (OutputInfo *)(iVar4._M_node + 2);
    }
    paVar1 = &local_110.first.field_2;
    local_90.OutDir._M_dataplus._M_p = (pointer)0x23;
    local_110.first._M_dataplus._M_p = (pointer)paVar1;
    local_110.first._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_90);
    local_110.first.field_2._M_allocated_capacity = (size_type)local_90.OutDir._M_dataplus._M_p;
    builtin_strncpy(local_110.first._M_dataplus._M_p,"cmTarget::GetOutputInfo called for ",0x23);
    local_110.first._M_string_length = (size_type)local_90.OutDir._M_dataplus._M_p;
    local_110.first._M_dataplus._M_p[(long)local_90.OutDir._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)(this->Name)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_110);
    GetTargetTypeName(this->TargetTypeValue);
    std::__cxx11::string::append((char *)&local_110);
    cmMakefile::IssueMessage(this->Makefile,INTERNAL_ERROR,&local_110.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
  }
  return (OutputInfo *)0x0;
}

Assistant:

cmTarget::OutputInfo const* cmTarget::GetOutputInfo(
    const std::string& config) const
{
  // There is no output information for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  // Only libraries and executables have well-defined output files.
  if(!this->HaveWellDefinedOutputFiles())
    {
    std::string msg = "cmTarget::GetOutputInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmTarget::GetTargetTypeName(this->GetType());
    this->GetMakefile()->IssueMessage(cmake::INTERNAL_ERROR, msg);
    return 0;
    }

  // Lookup/compute/cache the output information for this configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  typedef cmTargetInternals::OutputInfoMapType OutputInfoMapType;
  OutputInfoMapType::const_iterator i =
    this->Internal->OutputInfoMap.find(config_upper);
  if(i == this->Internal->OutputInfoMap.end())
    {
    OutputInfo info;
    this->ComputeOutputDir(config, false, info.OutDir);
    this->ComputeOutputDir(config, true, info.ImpDir);
    if(!this->ComputePDBOutputDir("PDB", config, info.PdbDir))
      {
      info.PdbDir = info.OutDir;
      }
    OutputInfoMapType::value_type entry(config_upper, info);
    i = this->Internal->OutputInfoMap.insert(entry).first;
    }
  return &i->second;
}